

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Status_f2c(MPIABI_Fint *f_status,MPIABI_Status *c_status)

{
  int iVar1;
  MPI_Status *mpi_status_ptr;
  
  iVar1 = MPI_Status_f2c();
  if (c_status != (MPIABI_Status *)0x0) {
    c_status->MPI_SOURCE = (int)*(undefined8 *)&c_status->mpi_status;
    c_status->MPI_TAG = (int)((ulong)*(undefined8 *)&c_status->mpi_status >> 0x20);
    c_status->MPI_ERROR = (c_status->mpi_status).status_OpenMPI.f2;
  }
  return iVar1;
}

Assistant:

int MPIABI_Status_f2c(
  const MPIABI_Fint * f_status,
  MPIABI_Status * c_status
) {
  return MPI_Status_f2c(
    (const MPI_Fint *)(const WPI_Fint *)f_status,
    (MPI_Status *)(WPI_StatusPtr)c_status
  );
}